

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUrightNoNZ(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *vec,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *rhs,int *ridx,int rn,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *eps)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  uint uVar10;
  uint uVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  uint uVar17;
  int *piVar18;
  double a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  cpp_dec_float<50U,_int,_void> local_248;
  cpp_dec_float<50U,_int,_void> local_208;
  ulong local_1d0;
  uint *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  cpp_dec_float<50U,_int,_void> local_1b8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  int *local_168;
  pointer local_160;
  int *local_158;
  int *local_150;
  int *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  int *local_138;
  int *local_130;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_208.fpclass = cpp_dec_float_finite;
  local_208.prec_elem = 10;
  local_208.data._M_elems[0] = 0;
  local_208.data._M_elems[1] = 0;
  local_208.data._M_elems[2] = 0;
  local_208.data._M_elems[3] = 0;
  local_208.data._M_elems[4] = 0;
  local_208.data._M_elems[5] = 0;
  local_208.data._M_elems._24_5_ = 0;
  local_208.data._M_elems[7]._1_3_ = 0;
  local_208.data._M_elems[8] = 0;
  local_208.data._M_elems[9] = 0;
  local_208.exp = 0;
  local_208.neg = false;
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 10;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems._24_5_ = 0;
  local_1b8.data._M_elems[7]._1_3_ = 0;
  local_1b8.data._M_elems[8] = 0;
  local_1b8.data._M_elems[9] = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  if (0 < rn) {
    local_138 = (this->row).orig;
    local_130 = (this->row).perm;
    local_148 = (this->col).orig;
    local_158 = (this->u).col.idx;
    local_160 = (this->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_150 = (this->u).col.len;
    local_168 = (this->u).col.start;
    local_1c8 = (uint *)ridx;
    local_1c0 = rhs;
    local_178 = this;
    local_170 = eps;
    local_140 = vec;
    do {
      uVar14 = *ridx;
      if ((double)(int)uVar14 * 0.2 < (double)rn) {
        if ((int)uVar14 < 0) {
          return;
        }
        uVar13 = (ulong)uVar14;
        do {
          pcVar12 = &local_1c0[local_138[uVar13]].m_backend;
          pcVar9 = &(local_178->diag).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_138[uVar13]].m_backend;
          local_248.fpclass = cpp_dec_float_finite;
          local_248.prec_elem = 10;
          local_248.data._M_elems[0] = 0;
          local_248.data._M_elems[1] = 0;
          local_248.data._M_elems[2] = 0;
          local_248.data._M_elems[3] = 0;
          local_248.data._M_elems[4] = 0;
          local_248.data._M_elems[5] = 0;
          local_248.data._M_elems._24_5_ = 0;
          local_248.data._M_elems[7]._1_3_ = 0;
          local_248.data._M_elems._32_5_ = 0;
          local_248.data._M_elems[9]._1_3_ = 0;
          local_248.exp = 0;
          local_248.neg = false;
          pcVar16 = pcVar9;
          if ((&local_248 != pcVar12) && (pcVar16 = pcVar12, &local_248 != pcVar9)) {
            uVar3 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
            local_248.data._M_elems._32_5_ = SUB85(uVar3,0);
            local_248.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
            local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
            local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
            uVar3 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
            local_248.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_248.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_248.exp = pcVar9->exp;
            local_248.neg = pcVar9->neg;
            local_248.fpclass = pcVar9->fpclass;
            local_248.prec_elem = pcVar9->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_248,pcVar16);
          local_208.data._M_elems[0] = local_248.data._M_elems[0];
          local_208.data._M_elems[1] = local_248.data._M_elems[1];
          local_208.data._M_elems[2] = local_248.data._M_elems[2];
          local_208.data._M_elems[3] = local_248.data._M_elems[3];
          local_208.data._M_elems[4] = local_248.data._M_elems[4];
          local_208.data._M_elems[5] = local_248.data._M_elems[5];
          local_208.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
          local_208.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
          local_208.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
          local_208.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
          local_208.exp = local_248.exp;
          local_208.neg = local_248.neg;
          local_208.fpclass = local_248.fpclass;
          local_208.prec_elem = local_248.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(pcVar12,0);
          local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
          local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
          local_248.data._M_elems[4] = local_208.data._M_elems[4];
          local_248.data._M_elems[5] = local_208.data._M_elems[5];
          local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
          local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
          local_248.data._M_elems[2] = local_208.data._M_elems[2];
          local_248.data._M_elems[3] = local_208.data._M_elems[3];
          local_248.data._M_elems[0] = local_208.data._M_elems[0];
          local_248.data._M_elems[1] = local_208.data._M_elems[1];
          auVar5 = (undefined1  [16])local_248.data._M_elems._0_16_;
          local_68.data._M_elems._0_8_ = *(undefined8 *)(local_170->m_backend).data._M_elems;
          local_68.data._M_elems._8_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 2);
          local_68.data._M_elems._16_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 4);
          local_68.data._M_elems._24_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 6);
          local_68.data._M_elems._32_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 8);
          local_68.exp = (local_170->m_backend).exp;
          local_68.neg = (local_170->m_backend).neg;
          local_68.fpclass = (local_170->m_backend).fpclass;
          local_68.prec_elem = (local_170->m_backend).prec_elem;
          local_248.exp = local_208.exp;
          local_248.neg = local_208.neg;
          local_248.fpclass = local_208.fpclass;
          local_248.prec_elem = local_208.prec_elem;
          if ((local_208.neg == true) &&
             (local_248.data._M_elems[0] = local_208.data._M_elems[0],
             local_248.data._M_elems[0] != 0 || local_208.fpclass != cpp_dec_float_finite)) {
            local_248.neg = false;
          }
          if ((local_68.fpclass != cpp_dec_float_NaN && local_208.fpclass != cpp_dec_float_NaN) &&
             (local_248.data._M_elems._0_16_ = auVar5,
             iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_248,&local_68), 0 < iVar6)) {
            iVar6 = local_148[uVar13];
            *(undefined8 *)(local_140[iVar6].m_backend.data._M_elems + 8) =
                 local_208.data._M_elems._32_8_;
            puVar2 = local_140[iVar6].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar2 = local_208.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_208.data._M_elems[7]._1_3_,local_208.data._M_elems._24_5_);
            *(undefined8 *)local_140[iVar6].m_backend.data._M_elems = local_208.data._M_elems._0_8_;
            *(undefined8 *)(local_140[iVar6].m_backend.data._M_elems + 2) =
                 local_208.data._M_elems._8_8_;
            local_140[iVar6].m_backend.exp = local_208.exp;
            local_140[iVar6].m_backend.neg = local_208.neg;
            local_140[iVar6].m_backend.fpclass = local_208.fpclass;
            local_140[iVar6].m_backend.prec_elem = local_208.prec_elem;
            if (0 < local_150[iVar6]) {
              piVar18 = local_158 + local_168[iVar6];
              pcVar12 = &local_160[local_168[iVar6]].m_backend;
              uVar14 = local_150[iVar6] + 1;
              do {
                local_248.fpclass = cpp_dec_float_finite;
                local_248.prec_elem = 10;
                local_248.data._M_elems[0] = 0;
                local_248.data._M_elems[1] = 0;
                local_248.data._M_elems[2] = 0;
                local_248.data._M_elems[3] = 0;
                local_248.data._M_elems[4] = 0;
                local_248.data._M_elems[5] = 0;
                local_248.data._M_elems._24_5_ = 0;
                local_248.data._M_elems[7]._1_3_ = 0;
                local_248.data._M_elems._32_5_ = 0;
                local_248.data._M_elems[9]._1_3_ = 0;
                local_248.exp = 0;
                local_248.neg = false;
                pcVar16 = &local_208;
                if (pcVar12 != &local_248) {
                  local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
                  local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
                  local_248.data._M_elems[4] = local_208.data._M_elems[4];
                  local_248.data._M_elems[5] = local_208.data._M_elems[5];
                  local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
                  local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
                  local_248.data._M_elems[2] = local_208.data._M_elems[2];
                  local_248.data._M_elems[3] = local_208.data._M_elems[3];
                  local_248.data._M_elems[0] = local_208.data._M_elems[0];
                  local_248.data._M_elems[1] = local_208.data._M_elems[1];
                  local_248.exp = local_208.exp;
                  local_248.neg = local_208.neg;
                  local_248.fpclass = local_208.fpclass;
                  local_248.prec_elem = local_208.prec_elem;
                  pcVar16 = pcVar12;
                }
                pcVar12 = pcVar12 + 1;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_248,pcVar16);
                iVar6 = *piVar18;
                piVar18 = piVar18 + 1;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_1c0[iVar6].m_backend,&local_248);
                uVar14 = uVar14 - 1;
              } while (1 < uVar14);
            }
          }
          bVar4 = 0 < (long)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar4);
        return;
      }
      local_1d0 = (ulong)(rn - 1U);
      uVar10 = ((uint *)ridx)[local_1d0];
      if ((uint)rn < 4) {
        iVar8 = 1;
        iVar6 = 0;
      }
      else {
        iVar8 = 1;
        iVar6 = 0;
        do {
          uVar11 = ((uint *)ridx)[iVar8];
          uVar17 = ((uint *)ridx)[(long)iVar8 + 1];
          if ((int)uVar17 < (int)uVar11) {
            iVar7 = iVar8;
            uVar17 = uVar11;
            if ((int)uVar11 <= (int)uVar10) goto LAB_002892c2;
          }
          else {
            if ((int)uVar17 <= (int)uVar10) goto LAB_002892c2;
            iVar7 = iVar8 + 1;
          }
          ((uint *)ridx)[iVar6] = uVar17;
          iVar8 = iVar7 * 2 + 1;
          iVar6 = iVar7;
        } while (iVar8 < (int)(rn - 2U));
      }
      if ((iVar8 < (int)(rn - 1U)) && ((int)uVar10 < (int)((uint *)ridx)[iVar8])) {
        ((uint *)ridx)[iVar6] = ((uint *)ridx)[iVar8];
        iVar6 = iVar8;
      }
LAB_002892c2:
      ((uint *)ridx)[iVar6] = uVar10;
      pcVar12 = &local_1c0[local_138[(int)uVar14]].m_backend;
      pcVar9 = &(local_178->diag).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_138[(int)uVar14]].m_backend;
      local_248.fpclass = cpp_dec_float_finite;
      local_248.prec_elem = 10;
      local_248.data._M_elems[0] = 0;
      local_248.data._M_elems[1] = 0;
      local_248.data._M_elems[2] = 0;
      local_248.data._M_elems[3] = 0;
      local_248.data._M_elems[4] = 0;
      local_248.data._M_elems[5] = 0;
      local_248.data._M_elems._24_5_ = 0;
      local_248.data._M_elems[7]._1_3_ = 0;
      local_248.data._M_elems._32_5_ = 0;
      local_248.data._M_elems[9]._1_3_ = 0;
      local_248.exp = 0;
      local_248.neg = false;
      pcVar16 = pcVar9;
      if ((&local_248 != pcVar12) && (pcVar16 = pcVar12, &local_248 != pcVar9)) {
        uVar3 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
        local_248.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_248.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
        local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
        local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
        uVar3 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
        local_248.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_248.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_248.exp = pcVar9->exp;
        local_248.neg = pcVar9->neg;
        local_248.fpclass = pcVar9->fpclass;
        local_248.prec_elem = pcVar9->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_248,pcVar16)
      ;
      local_208.data._M_elems[0] = local_248.data._M_elems[0];
      local_208.data._M_elems[1] = local_248.data._M_elems[1];
      local_208.data._M_elems[2] = local_248.data._M_elems[2];
      local_208.data._M_elems[3] = local_248.data._M_elems[3];
      local_208.data._M_elems[4] = local_248.data._M_elems[4];
      local_208.data._M_elems[5] = local_248.data._M_elems[5];
      local_208.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
      local_208.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
      local_208.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
      local_208.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
      local_208.exp = local_248.exp;
      local_208.neg = local_248.neg;
      local_208.fpclass = local_248.fpclass;
      local_208.prec_elem = local_248.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(pcVar12,0);
      local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
      local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
      local_248.data._M_elems[4] = local_208.data._M_elems[4];
      local_248.data._M_elems[5] = local_208.data._M_elems[5];
      local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
      local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
      local_248.data._M_elems[2] = local_208.data._M_elems[2];
      local_248.data._M_elems[3] = local_208.data._M_elems[3];
      local_248.data._M_elems[0] = local_208.data._M_elems[0];
      local_248.data._M_elems[1] = local_208.data._M_elems[1];
      auVar5 = (undefined1  [16])local_248.data._M_elems._0_16_;
      local_a8.data._M_elems._0_8_ = *(undefined8 *)(local_170->m_backend).data._M_elems;
      local_a8.data._M_elems._8_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 2);
      local_a8.data._M_elems._16_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 4);
      local_a8.data._M_elems._24_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 6);
      local_a8.data._M_elems._32_8_ = *(undefined8 *)((local_170->m_backend).data._M_elems + 8);
      local_a8.exp = (local_170->m_backend).exp;
      local_a8.neg = (local_170->m_backend).neg;
      local_a8.fpclass = (local_170->m_backend).fpclass;
      local_a8.prec_elem = (local_170->m_backend).prec_elem;
      local_248.exp = local_208.exp;
      local_248.neg = local_208.neg;
      local_248.fpclass = local_208.fpclass;
      local_248.prec_elem = local_208.prec_elem;
      if ((local_208.neg == true) &&
         (local_248.data._M_elems[0] = local_208.data._M_elems[0],
         local_248.data._M_elems[0] != 0 || local_208.fpclass != cpp_dec_float_finite)) {
        local_248.neg = false;
      }
      if ((local_a8.fpclass != cpp_dec_float_NaN && local_208.fpclass != cpp_dec_float_NaN) &&
         (local_248.data._M_elems._0_16_ = auVar5,
         iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_248,&local_a8), 0 < iVar6)) {
        iVar6 = local_148[(int)uVar14];
        *(undefined8 *)(local_140[iVar6].m_backend.data._M_elems + 8) =
             local_208.data._M_elems._32_8_;
        puVar2 = local_140[iVar6].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = local_208.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_208.data._M_elems[7]._1_3_,local_208.data._M_elems._24_5_);
        *(undefined8 *)local_140[iVar6].m_backend.data._M_elems = local_208.data._M_elems._0_8_;
        *(undefined8 *)(local_140[iVar6].m_backend.data._M_elems + 2) =
             local_208.data._M_elems._8_8_;
        local_140[iVar6].m_backend.exp = local_208.exp;
        local_140[iVar6].m_backend.neg = local_208.neg;
        local_140[iVar6].m_backend.fpclass = local_208.fpclass;
        local_140[iVar6].m_backend.prec_elem = local_208.prec_elem;
        if (0 < local_150[iVar6]) {
          piVar18 = local_158 + local_168[iVar6];
          pcVar12 = &local_160[local_168[iVar6]].m_backend;
          iVar6 = local_150[iVar6];
          do {
            iVar8 = *piVar18;
            pnVar1 = local_1c0 + iVar8;
            local_1b8.data._M_elems._32_8_ =
                 *(undefined8 *)(local_1c0[iVar8].m_backend.data._M_elems + 8);
            local_1b8.data._M_elems._0_8_ = *(undefined8 *)local_1c0[iVar8].m_backend.data._M_elems;
            local_1b8.data._M_elems._8_8_ =
                 *(undefined8 *)(local_1c0[iVar8].m_backend.data._M_elems + 2);
            puVar2 = local_1c0[iVar8].m_backend.data._M_elems + 4;
            local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar3 = *(undefined8 *)(puVar2 + 2);
            local_1b8.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_1b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_1b8.exp = local_1c0[iVar8].m_backend.exp;
            local_1b8.neg = local_1c0[iVar8].m_backend.neg;
            local_1b8.fpclass = local_1c0[iVar8].m_backend.fpclass;
            local_1b8.prec_elem = local_1c0[iVar8].m_backend.prec_elem;
            if (local_1b8.fpclass == cpp_dec_float_NaN) {
LAB_00289599:
              local_248.fpclass = cpp_dec_float_finite;
              local_248.prec_elem = 10;
              local_248.data._M_elems[0] = 0;
              local_248.data._M_elems[1] = 0;
              local_248.data._M_elems[2] = 0;
              local_248.data._M_elems[3] = 0;
              local_248.data._M_elems[4] = 0;
              local_248.data._M_elems[5] = 0;
              local_248.data._M_elems._24_5_ = 0;
              local_248.data._M_elems[7]._1_3_ = 0;
              local_248.data._M_elems._32_5_ = 0;
              local_248.data._M_elems[9]._1_3_ = 0;
              local_248.exp = 0;
              local_248.neg = false;
              pcVar16 = &local_208;
              if (&local_248 != pcVar12) {
                local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
                local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
                local_248.data._M_elems[4] = local_208.data._M_elems[4];
                local_248.data._M_elems[5] = local_208.data._M_elems[5];
                local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
                local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
                local_248.data._M_elems[0] = local_208.data._M_elems[0];
                local_248.data._M_elems[1] = local_208.data._M_elems[1];
                local_248.data._M_elems[2] = local_208.data._M_elems[2];
                local_248.data._M_elems[3] = local_208.data._M_elems[3];
                local_248.exp = local_208.exp;
                local_248.neg = local_208.neg;
                local_248.fpclass = local_208.fpclass;
                local_248.prec_elem = local_208.prec_elem;
                pcVar16 = pcVar12;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_248,pcVar16);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1b8,&local_248);
              a = 0.0;
              if (local_1b8.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_248,0,(type *)0x0);
                iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_1b8,&local_248);
                a = 0.0;
                if (iVar8 == 0) {
                  a = 1e-100;
                }
              }
              local_248.fpclass = cpp_dec_float_finite;
              local_248.prec_elem = 10;
              local_248.data._M_elems._0_16_ = ZEXT816(0);
              local_248.data._M_elems[4] = 0;
              local_248.data._M_elems[5] = 0;
              local_248.data._M_elems._24_5_ = 0;
              local_248.data._M_elems[7]._1_3_ = 0;
              local_248.data._M_elems._32_5_ = 0;
              local_248.data._M_elems[9]._1_3_ = 0;
              local_248.exp = 0;
              local_248.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_248,a);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_1b8,&local_248);
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 8) =
                   local_1b8.data._M_elems._32_8_;
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) =
                   local_1b8.data._M_elems._16_8_;
              *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                   CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
              *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
              *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_1b8.data._M_elems._8_8_
              ;
              (pnVar1->m_backend).exp = local_1b8.exp;
              (pnVar1->m_backend).neg = local_1b8.neg;
              (pnVar1->m_backend).fpclass = local_1b8.fpclass;
              (pnVar1->m_backend).prec_elem = local_1b8.prec_elem;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_248,0,(type *)0x0);
              iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_1b8,&local_248);
              if (iVar7 != 0) goto LAB_00289599;
              local_128.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
              local_128.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
              local_128.data._M_elems[0] = local_208.data._M_elems[0];
              local_128.data._M_elems[1] = local_208.data._M_elems[1];
              uVar3 = local_128.data._M_elems._0_8_;
              local_128.data._M_elems[2] = local_208.data._M_elems[2];
              local_128.data._M_elems[3] = local_208.data._M_elems[3];
              local_128.data._M_elems[8] = local_208.data._M_elems[8];
              local_128.data._M_elems[9] = local_208.data._M_elems[9];
              local_128.data._M_elems[4] = local_208.data._M_elems[4];
              local_128.data._M_elems[5] = local_208.data._M_elems[5];
              local_128.exp = local_208.exp;
              local_128.fpclass = local_208.fpclass;
              local_128.prec_elem = local_208.prec_elem;
              local_128.data._M_elems[0] = local_208.data._M_elems[0];
              local_128.neg = local_208.neg;
              if (local_128.data._M_elems[0] != 0 || local_208.fpclass != cpp_dec_float_finite) {
                local_128.neg = (bool)(local_208.neg ^ 1);
              }
              local_248.fpclass = cpp_dec_float_finite;
              local_248.prec_elem = 10;
              local_248.data._M_elems[0] = 0;
              local_248.data._M_elems[1] = 0;
              local_248.data._M_elems[2] = 0;
              local_248.data._M_elems[3] = 0;
              local_248.data._M_elems[4] = 0;
              local_248.data._M_elems[5] = 0;
              local_248.data._M_elems._24_5_ = 0;
              local_248.data._M_elems[7]._1_3_ = 0;
              local_248.data._M_elems._32_5_ = 0;
              local_248.data._M_elems[9]._1_3_ = 0;
              local_248.exp = 0;
              local_248.neg = false;
              pcVar16 = &local_128;
              if (&local_248 != pcVar12) {
                local_248.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
                local_248.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
                local_248.data._M_elems[4] = local_208.data._M_elems[4];
                local_248.data._M_elems[5] = local_208.data._M_elems[5];
                local_248.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
                local_248.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
                local_248.data._M_elems[0] = local_208.data._M_elems[0];
                local_248.data._M_elems[1] = local_208.data._M_elems[1];
                local_248.data._M_elems[2] = local_208.data._M_elems[2];
                local_248.data._M_elems[3] = local_208.data._M_elems[3];
                local_248.exp = local_208.exp;
                local_248.fpclass = local_208.fpclass;
                local_248.prec_elem = local_208.prec_elem;
                pcVar16 = pcVar12;
                local_248.neg = local_128.neg;
              }
              local_128.data._M_elems._0_8_ = uVar3;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_248,pcVar16);
              local_1b8.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
              local_1b8.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
              local_1b8.data._M_elems[4] = local_248.data._M_elems[4];
              local_1b8.data._M_elems[5] = local_248.data._M_elems[5];
              local_1b8.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
              local_1b8.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
              local_1b8.data._M_elems[0] = local_248.data._M_elems[0];
              local_1b8.data._M_elems[1] = local_248.data._M_elems[1];
              local_1b8.data._M_elems[2] = local_248.data._M_elems[2];
              local_1b8.data._M_elems[3] = local_248.data._M_elems[3];
              local_1b8.exp = local_248.exp;
              local_1b8.neg = local_248.neg;
              local_1b8.prec_elem = local_248.prec_elem;
              local_1b8.fpclass = local_248.fpclass;
              auVar5 = (undefined1  [16])local_248.data._M_elems._0_16_;
              local_e8.data._M_elems._32_8_ =
                   *(undefined8 *)((local_170->m_backend).data._M_elems + 8);
              local_e8.data._M_elems._0_8_ = *(undefined8 *)(local_170->m_backend).data._M_elems;
              local_e8.data._M_elems._8_8_ =
                   *(undefined8 *)((local_170->m_backend).data._M_elems + 2);
              local_e8.data._M_elems._16_8_ =
                   *(undefined8 *)((local_170->m_backend).data._M_elems + 4);
              local_e8.data._M_elems._24_8_ =
                   *(undefined8 *)((local_170->m_backend).data._M_elems + 6);
              local_e8.exp = (local_170->m_backend).exp;
              local_e8.neg = (local_170->m_backend).neg;
              local_e8.fpclass = (local_170->m_backend).fpclass;
              local_e8.prec_elem = (local_170->m_backend).prec_elem;
              if ((local_248.neg == true) &&
                 (local_248.data._M_elems[0] != 0 || local_248.fpclass != cpp_dec_float_finite)) {
                local_248.neg = false;
              }
              local_248.data._M_elems._0_16_ = auVar5;
              if ((local_e8.fpclass != cpp_dec_float_NaN && local_248.fpclass != cpp_dec_float_NaN)
                 && (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_248,&local_e8), 0 < iVar7)) {
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 8) =
                     local_1b8.data._M_elems._32_8_;
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) =
                     local_1b8.data._M_elems._16_8_;
                *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                     CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
                *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
                *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) =
                     local_1b8.data._M_elems._8_8_;
                (pnVar1->m_backend).exp = local_1b8.exp;
                (pnVar1->m_backend).neg = local_1b8.neg;
                (pnVar1->m_backend).fpclass = local_1b8.fpclass;
                (pnVar1->m_backend).prec_elem = local_1b8.prec_elem;
                uVar14 = local_130[iVar8];
                uVar11 = (uint)local_1d0;
                uVar10 = uVar11;
                if (0 < (int)uVar11) {
                  do {
                    uVar15 = (uint)local_1d0 - 1;
                    uVar17 = uVar15 >> 1;
                    uVar10 = (uint)local_1d0;
                    if ((int)uVar14 <= (int)local_1c8[uVar17]) break;
                    local_1c8[local_1d0 & 0xffffffff] = local_1c8[uVar17];
                    local_1d0 = (ulong)uVar17;
                    uVar10 = uVar17;
                  } while (1 < uVar15);
                }
                local_1d0 = (ulong)(uVar11 + 1);
                local_1c8[(int)uVar10] = uVar14;
              }
            }
            piVar18 = piVar18 + 1;
            pcVar12 = pcVar12 + 1;
            bVar4 = 1 < iVar6;
            ridx = (int *)local_1c8;
            iVar6 = iVar6 + -1;
          } while (bVar4);
        }
      }
      rn = (int)local_1d0;
    } while (0 < rn);
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveUrightNoNZ(R* vec,
                                    R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   while(rn > 0)
   {
      if(rn > *ridx * verySparseFactor4right)
      {
         /* continue with dense case */
         for(i = *ridx; i >= 0; --i)
         {
            assert(i >= 0 && i < thedim);
            r = rorig[i];
            assert(r >= 0 && r < thedim);
            x = diag[r] * rhs[r];
            rhs[r] = 0;

            if(isNotZero(x, eps))
            {
               c = corig[i];
               vec[c] = x;
               val = &cval[cbeg[c]];
               idx = &cidx[cbeg[c]];
               j = clen[c];

               while(j-- > 0)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  rhs[*idx++] -= x * (*val++);
               }
            }
         }

         break;
      }

      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);

      assert(i >= 0 && i < thedim);

      r = rorig[i];

      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];

      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }
      }
   }
}